

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O2

int xmlShellDir(xmlShellCtxtPtr ctxt,char *arg,xmlNodePtr node,xmlNodePtr node2)

{
  xmlElementType xVar1;
  
  if (ctxt != (xmlShellCtxtPtr)0x0) {
    if (node == (xmlNodePtr)0x0) {
      fwrite("NULL\n",5,1,(FILE *)ctxt->output);
    }
    else {
      xVar1 = node->type;
      if (xVar1 == XML_ATTRIBUTE_NODE) {
        xmlDebugDumpAttr(ctxt->output,(xmlAttrPtr)node,0);
      }
      else if ((xVar1 == XML_HTML_DOCUMENT_NODE) || (xVar1 == XML_DOCUMENT_NODE)) {
        xmlDebugDumpDocumentHead(ctxt->output,(xmlDocPtr)node);
      }
      else {
        xmlDebugDumpOneNode(ctxt->output,node,0);
      }
    }
  }
  return 0;
}

Assistant:

int
xmlShellDir(xmlShellCtxtPtr ctxt ATTRIBUTE_UNUSED,
            char *arg ATTRIBUTE_UNUSED, xmlNodePtr node,
            xmlNodePtr node2 ATTRIBUTE_UNUSED)
{
    if (!ctxt)
        return (0);
    if (node == NULL) {
	fprintf(ctxt->output, "NULL\n");
	return (0);
    }
    if ((node->type == XML_DOCUMENT_NODE) ||
        (node->type == XML_HTML_DOCUMENT_NODE)) {
        xmlDebugDumpDocumentHead(ctxt->output, (xmlDocPtr) node);
    } else if (node->type == XML_ATTRIBUTE_NODE) {
        xmlDebugDumpAttr(ctxt->output, (xmlAttrPtr) node, 0);
    } else {
        xmlDebugDumpOneNode(ctxt->output, node, 0);
    }
    return (0);
}